

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  int iVar4;
  pointer pnVar5;
  pointer pnVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int32_t iVar21;
  bool bVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  cpp_dec_float<100U,_int,_void> *pcVar26;
  VarStatus VVar27;
  long lVar28;
  cpp_dec_float<100U,_int,_void> *pcVar29;
  cpp_dec_float<100U,_int,_void> *pcVar30;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar31;
  VarStatus *pVVar32;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<100U,_int,_void> local_e8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  if ((this->m_isLast == true) && (lVar24 = (long)(this->m_perm).thesize, 0 < lVar24)) {
    lVar25 = lVar24 + 1;
    lVar24 = lVar24 * 0x14 + -2;
    do {
      lVar28 = (long)(this->m_perm).data[lVar25 + -2];
      if (-1 < lVar28) {
        pnVar5 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = *(undefined8 *)&pnVar5[lVar28].m_backend.data;
        uVar15 = *(undefined8 *)((long)&pnVar5[lVar28].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar5[lVar28].m_backend.data + 0x10);
        uVar16 = *(undefined8 *)puVar2;
        uVar17 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar5[lVar28].m_backend.data + 0x20);
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar5[lVar28].m_backend.data + 0x30);
        uVar20 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x18);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar20;
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x28);
        *puVar3 = uVar18;
        puVar3[1] = uVar19;
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x38);
        *puVar3 = uVar16;
        puVar3[1] = uVar17;
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x48);
        *puVar3 = uVar8;
        puVar3[1] = uVar15;
        *(int *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -8) = pnVar5[lVar28].m_backend.exp;
        *(bool *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -4) = pnVar5[lVar28].m_backend.neg;
        *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4) =
             *(undefined8 *)&pnVar5[lVar28].m_backend.fpclass;
        pnVar6 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar5 = pnVar6 + lVar28;
        uVar10 = (pnVar5->m_backend).data._M_elems[0];
        uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
        uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
        uVar13 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
        puVar2 = (uint *)((long)&pnVar6[lVar28].m_backend.data + 0x10);
        uVar8 = *(undefined8 *)puVar2;
        uVar15 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar6[lVar28].m_backend.data + 0x20);
        uVar16 = *(undefined8 *)puVar2;
        uVar17 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar6[lVar28].m_backend.data + 0x30);
        uVar18 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar24 * 4 + -0x18);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar18;
        puVar3 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar24 * 4 + -0x28);
        *puVar3 = uVar16;
        puVar3[1] = uVar17;
        puVar3 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar24 * 4 + -0x38);
        *puVar3 = uVar8;
        puVar3[1] = uVar15;
        puVar1 = (undefined4 *)((long)&(pnVar6->m_backend).data + lVar24 * 4 + -0x48);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        puVar1[2] = uVar12;
        puVar1[3] = uVar13;
        *(int *)((long)&(pnVar6->m_backend).data + lVar24 * 4 + -8) = pnVar6[lVar28].m_backend.exp;
        *(bool *)((long)&(pnVar6->m_backend).data + lVar24 * 4 + -4) = pnVar6[lVar28].m_backend.neg;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar24 * 4) =
             *(undefined8 *)&pnVar6[lVar28].m_backend.fpclass;
        rStatus->data[lVar25 + -2] = rStatus->data[lVar28];
      }
      lVar25 = lVar25 + -1;
      lVar24 = lVar24 + -0x14;
    } while (1 < lVar25);
  }
  if (0 < (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar24 = 0;
    lVar25 = 0;
    do {
      pNVar7 = (this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar7->val + 1) + lVar24) != this->m_i) {
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 0x10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems[6] = 0;
        local_e8.data._M_elems[7] = 0;
        local_e8.data._M_elems[8] = 0;
        local_e8.data._M_elems[9] = 0;
        local_e8.data._M_elems[10] = 0;
        local_e8.data._M_elems[0xb] = 0;
        local_e8.data._M_elems[0xc] = 0;
        local_e8.data._M_elems[0xd] = 0;
        local_e8.data._M_elems._56_5_ = 0;
        local_e8.data._M_elems[0xf]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_e8,
                   &(s->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(pNVar7->val).m_backend.data._M_elems + lVar24));
        iVar4 = *(int *)((long)(&((this->m_scale).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar24);
        pnVar6 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = local_e8.data._M_elems._48_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_e8.data._M_elems[0xf]._1_3_,local_e8.data._M_elems._56_5_);
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
        *(undefined8 *)puVar2 = local_e8.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._40_8_;
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_e8.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._24_8_;
        pnVar5 = pnVar6 + iVar4;
        (pnVar5->m_backend).data._M_elems[0] = local_e8.data._M_elems[0];
        *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_e8.data._M_elems[1];
        *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_e8.data._M_elems[2];
        *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_e8.data._M_elems[3];
        pnVar6[iVar4].m_backend.exp = local_e8.exp;
        pnVar6[iVar4].m_backend.neg = local_e8.neg;
        pnVar6[iVar4].m_backend.fpclass = local_e8.fpclass;
        pnVar6[iVar4].m_backend.prec_elem = local_e8.prec_elem;
      }
      lVar25 = lVar25 + 1;
      lVar24 = lVar24 + 0x54;
    } while (lVar25 < (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (0 < (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    local_40 = &this->m_i_rowObj;
    lVar25 = 0;
    lVar24 = 0;
    bVar22 = false;
    local_38 = y;
    do {
      pNVar7 = (this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar7->val + 1) + lVar25);
      iVar23 = this->m_i;
      VVar27 = rStatus->data[iVar23];
      if ((VVar27 == BASIC) || ((bVar22 && (iVar4 != iVar23)))) {
LAB_004454e4:
        pNVar7 = (this->m_rowObj).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pnVar6 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined4 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar25);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        uVar12 = puVar1[2];
        uVar13 = puVar1[3];
        puVar3 = (undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar25 + 0x10);
        uVar8 = *puVar3;
        uVar15 = puVar3[1];
        puVar3 = (undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar25 + 0x20);
        uVar16 = *puVar3;
        uVar17 = puVar3[1];
        puVar3 = (undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar25 + 0x30);
        uVar18 = puVar3[1];
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *puVar3;
        *(undefined8 *)(puVar2 + 2) = uVar18;
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
        *(undefined8 *)puVar2 = uVar16;
        *(undefined8 *)(puVar2 + 2) = uVar17;
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = uVar8;
        *(undefined8 *)(puVar2 + 2) = uVar15;
        pnVar5 = pnVar6 + iVar4;
        (pnVar5->m_backend).data._M_elems[0] = uVar10;
        *(uint *)((long)&(pnVar5->m_backend).data + 4) = uVar11;
        *(uint *)((long)&(pnVar5->m_backend).data + 8) = uVar12;
        *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = uVar13;
        pnVar6[iVar4].m_backend.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar25);
        pnVar6[iVar4].m_backend.neg =
             *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar25 + 4);
        uVar8 = *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar25 + 8);
        pnVar6[iVar4].m_backend.fpclass = (int)uVar8;
        pnVar6[iVar4].m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
        pVVar32 = rStatus->data + iVar4;
LAB_00445546:
        *pVVar32 = BASIC;
      }
      else if ((VVar27 == FIXED) && ((iVar4 == this->m_maxLhsIdx || (iVar4 == this->m_minRhsIdx))))
      {
        pcVar26 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend;
        pcVar29 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)(pNVar7->val).m_backend.data._M_elems + lVar25);
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 0x10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems[6] = 0;
        local_e8.data._M_elems[7] = 0;
        local_e8.data._M_elems[8] = 0;
        local_e8.data._M_elems[9] = 0;
        local_e8.data._M_elems[10] = 0;
        local_e8.data._M_elems[0xb] = 0;
        local_e8.data._M_elems[0xc] = 0;
        local_e8.data._M_elems[0xd] = 0;
        local_e8.data._M_elems._56_5_ = 0;
        local_e8.data._M_elems[0xf]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        pcVar30 = pcVar26;
        if ((pcVar29 != &local_e8) && (pcVar30 = pcVar29, &local_e8 != pcVar26)) {
          local_e8.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems;
          local_e8.data._M_elems._8_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 2);
          local_e8.data._M_elems._16_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 4);
          local_e8.data._M_elems._24_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 6);
          local_e8.data._M_elems._32_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 8);
          local_e8.data._M_elems._40_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 10);
          local_e8.data._M_elems._48_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xc);
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xe);
          local_e8.data._M_elems._56_5_ = SUB85(uVar8,0);
          local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
          local_e8.exp = pcVar26->exp;
          local_e8.neg = pcVar26->neg;
          local_e8.fpclass = pcVar26->fpclass;
          local_e8.prec_elem = pcVar26->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_e8,pcVar30);
        pnVar5 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar5[iVar4].m_backend.data = local_e8.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = local_e8.data._M_elems._8_8_;
        puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_e8.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._24_8_;
        puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x20);
        *(undefined8 *)puVar2 = local_e8.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._40_8_;
        puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = local_e8.data._M_elems._48_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_e8.data._M_elems[0xf]._1_3_,local_e8.data._M_elems._56_5_);
        pnVar5[iVar4].m_backend.exp = local_e8.exp;
        pnVar5[iVar4].m_backend.neg = local_e8.neg;
        pnVar5[iVar4].m_backend.fpclass = local_e8.fpclass;
        pnVar5[iVar4].m_backend.prec_elem = local_e8.prec_elem;
        iVar23 = this->m_i;
        pnVar6 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (local_40->m_backend).data._M_elems[0];
        uVar12 = (local_40->m_backend).data._M_elems[1];
        uVar13 = (local_40->m_backend).data._M_elems[2];
        uVar14 = (local_40->m_backend).data._M_elems[3];
        uVar8 = *(undefined8 *)((local_40->m_backend).data._M_elems + 4);
        uVar15 = *(undefined8 *)((local_40->m_backend).data._M_elems + 6);
        uVar16 = *(undefined8 *)((local_40->m_backend).data._M_elems + 8);
        uVar17 = *(undefined8 *)((local_40->m_backend).data._M_elems + 10);
        uVar18 = *(undefined8 *)((local_40->m_backend).data._M_elems + 0xe);
        puVar2 = (uint *)((long)&pnVar6[iVar23].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)((local_40->m_backend).data._M_elems + 0xc);
        *(undefined8 *)(puVar2 + 2) = uVar18;
        puVar2 = (uint *)((long)&pnVar6[iVar23].m_backend.data + 0x20);
        *(undefined8 *)puVar2 = uVar16;
        *(undefined8 *)(puVar2 + 2) = uVar17;
        puVar2 = (uint *)((long)&pnVar6[iVar23].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = uVar8;
        *(undefined8 *)(puVar2 + 2) = uVar15;
        pnVar5 = pnVar6 + iVar23;
        (pnVar5->m_backend).data._M_elems[0] = uVar11;
        *(uint *)((long)&(pnVar5->m_backend).data + 4) = uVar12;
        *(uint *)((long)&(pnVar5->m_backend).data + 8) = uVar13;
        *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = uVar14;
        pnVar6[iVar23].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
        pnVar6[iVar23].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
        iVar21 = (this->m_i_rowObj).m_backend.prec_elem;
        pnVar6[iVar23].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
        pnVar6[iVar23].m_backend.prec_elem = iVar21;
        if ((this->m_isLhsEqualRhs).data[lVar24] == true) {
          rStatus->data[iVar4] = FIXED;
        }
        else {
          if (iVar4 == this->m_maxLhsIdx) {
            pNVar9 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar9->val).m_backend.data._M_elems + lVar25);
            local_98.val.m_backend.fpclass = cpp_dec_float_finite;
            local_98.val.m_backend.prec_elem = 0x10;
            local_98.val.m_backend.data._M_elems[0] = 0;
            local_98.val.m_backend.data._M_elems[1] = 0;
            local_98.val.m_backend.data._M_elems[2] = 0;
            local_98.val.m_backend.data._M_elems[3] = 0;
            local_98.val.m_backend.data._M_elems[4] = 0;
            local_98.val.m_backend.data._M_elems[5] = 0;
            local_98.val.m_backend.data._M_elems[6] = 0;
            local_98.val.m_backend.data._M_elems[7] = 0;
            local_98.val.m_backend.data._M_elems[8] = 0;
            local_98.val.m_backend.data._M_elems[9] = 0;
            local_98.val.m_backend.data._M_elems[10] = 0;
            local_98.val.m_backend.data._M_elems[0xb] = 0;
            local_98.val.m_backend.data._M_elems[0xc] = 0;
            local_98.val.m_backend.data._M_elems[0xd] = 0;
            local_98.val.m_backend.data._M_elems._56_5_ = 0;
            local_98.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
            local_98.val.m_backend.exp = 0;
            local_98.val.m_backend.neg = false;
            pNVar31 = pNVar7;
            if ((&local_98 != pNVar9) && (pNVar31 = pNVar9, pNVar7 != &local_98)) {
              local_98.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
              local_98.val.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
              local_98.val.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
              local_98.val.m_backend.data._M_elems._24_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
              local_98.val.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
              local_98.val.m_backend.data._M_elems._40_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 10);
              local_98.val.m_backend.data._M_elems._48_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xc);
              uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xe);
              local_98.val.m_backend.data._M_elems._56_5_ = SUB85(uVar8,0);
              local_98.val.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              local_98.val.m_backend.exp =
                   *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25);
              local_98.val.m_backend.neg =
                   *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 4);
              local_98.val.m_backend._72_8_ =
                   *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)&local_98,
                       (cpp_dec_float<100U,_int,_void> *)pNVar31);
            VVar27 = ON_UPPER;
            if (local_98.val.m_backend.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_e8,0,(type *)0x0);
              iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)&local_98,&local_e8);
              VVar27 = (VarStatus)(0 < iVar23);
            }
          }
          else {
            pNVar9 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar9->val).m_backend.data._M_elems + lVar25);
            local_98.val.m_backend.fpclass = cpp_dec_float_finite;
            local_98.val.m_backend.prec_elem = 0x10;
            local_98.val.m_backend.data._M_elems[0] = 0;
            local_98.val.m_backend.data._M_elems[1] = 0;
            local_98.val.m_backend.data._M_elems[2] = 0;
            local_98.val.m_backend.data._M_elems[3] = 0;
            local_98.val.m_backend.data._M_elems[4] = 0;
            local_98.val.m_backend.data._M_elems[5] = 0;
            local_98.val.m_backend.data._M_elems[6] = 0;
            local_98.val.m_backend.data._M_elems[7] = 0;
            local_98.val.m_backend.data._M_elems[8] = 0;
            local_98.val.m_backend.data._M_elems[9] = 0;
            local_98.val.m_backend.data._M_elems[10] = 0;
            local_98.val.m_backend.data._M_elems[0xb] = 0;
            local_98.val.m_backend.data._M_elems[0xc] = 0;
            local_98.val.m_backend.data._M_elems[0xd] = 0;
            local_98.val.m_backend.data._M_elems._56_5_ = 0;
            local_98.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
            local_98.val.m_backend.exp = 0;
            local_98.val.m_backend.neg = false;
            pNVar31 = pNVar7;
            if ((&local_98 != pNVar9) && (pNVar31 = pNVar9, pNVar7 != &local_98)) {
              local_98.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
              local_98.val.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
              local_98.val.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
              local_98.val.m_backend.data._M_elems._24_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
              local_98.val.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
              local_98.val.m_backend.data._M_elems._40_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 10);
              local_98.val.m_backend.data._M_elems._48_8_ =
                   *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xc);
              uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xe);
              local_98.val.m_backend.data._M_elems._56_5_ = SUB85(uVar8,0);
              local_98.val.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              local_98.val.m_backend.exp =
                   *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25);
              local_98.val.m_backend.neg =
                   *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 4);
              local_98.val.m_backend._72_8_ =
                   *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)&local_98,
                       (cpp_dec_float<100U,_int,_void> *)pNVar31);
            VVar27 = ON_LOWER;
            if (local_98.val.m_backend.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_e8,0,(type *)0x0);
              iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)&local_98,&local_e8);
              VVar27 = (VarStatus)(iVar23 < 1);
            }
          }
          rStatus->data[iVar4] = VVar27;
        }
        bVar22 = true;
        if (iVar4 != this->m_i) {
          pVVar32 = rStatus->data + this->m_i;
          bVar22 = true;
          goto LAB_00445546;
        }
      }
      else {
        if ((VVar27 == ON_LOWER) && (iVar4 == this->m_maxLhsIdx)) {
          pcVar26 = &(y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend;
          pcVar29 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)(pNVar7->val).m_backend.data._M_elems + lVar25);
          local_e8.fpclass = cpp_dec_float_finite;
          local_e8.prec_elem = 0x10;
          local_e8.data._M_elems[0] = 0;
          local_e8.data._M_elems[1] = 0;
          local_e8.data._M_elems[2] = 0;
          local_e8.data._M_elems[3] = 0;
          local_e8.data._M_elems[4] = 0;
          local_e8.data._M_elems[5] = 0;
          local_e8.data._M_elems[6] = 0;
          local_e8.data._M_elems[7] = 0;
          local_e8.data._M_elems[8] = 0;
          local_e8.data._M_elems[9] = 0;
          local_e8.data._M_elems[10] = 0;
          local_e8.data._M_elems[0xb] = 0;
          local_e8.data._M_elems[0xc] = 0;
          local_e8.data._M_elems[0xd] = 0;
          local_e8.data._M_elems._56_5_ = 0;
          local_e8.data._M_elems[0xf]._1_3_ = 0;
          local_e8.exp = 0;
          local_e8.neg = false;
          pcVar30 = pcVar26;
          if ((pcVar29 != &local_e8) && (pcVar30 = pcVar29, &local_e8 != pcVar26)) {
            local_e8.data._M_elems._0_8_ =
                 *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems;
            local_e8.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 2);
            local_e8.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 4);
            local_e8.data._M_elems._24_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 6);
            local_e8.data._M_elems._32_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 8);
            local_e8.data._M_elems._40_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 10);
            local_e8.data._M_elems._48_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xc);
            uVar8 = *(undefined8 *)
                     ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xe);
            local_e8.data._M_elems._56_5_ = SUB85(uVar8,0);
            local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_e8.exp = pcVar26->exp;
            local_e8.neg = pcVar26->neg;
            local_e8.fpclass = pcVar26->fpclass;
            local_e8.prec_elem = pcVar26->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    (&local_e8,pcVar30);
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar5[iVar4].m_backend.data = local_e8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = local_e8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = local_e8.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._24_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x20);
          *(undefined8 *)puVar2 = local_e8.data._M_elems._32_8_;
          *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._40_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x30);
          *(undefined8 *)puVar2 = local_e8.data._M_elems._48_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_e8.data._M_elems[0xf]._1_3_,local_e8.data._M_elems._56_5_);
          pnVar5[iVar4].m_backend.exp = local_e8.exp;
          pnVar5[iVar4].m_backend.neg = local_e8.neg;
          pnVar5[iVar4].m_backend.fpclass = local_e8.fpclass;
          pnVar5[iVar4].m_backend.prec_elem = local_e8.prec_elem;
          iVar23 = this->m_i;
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = *(undefined8 *)(local_40->m_backend).data._M_elems;
          uVar15 = *(undefined8 *)((local_40->m_backend).data._M_elems + 2);
          uVar16 = *(undefined8 *)((local_40->m_backend).data._M_elems + 4);
          uVar17 = *(undefined8 *)((local_40->m_backend).data._M_elems + 6);
          uVar18 = *(undefined8 *)((local_40->m_backend).data._M_elems + 8);
          uVar19 = *(undefined8 *)((local_40->m_backend).data._M_elems + 10);
          uVar20 = *(undefined8 *)((local_40->m_backend).data._M_elems + 0xe);
          puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x30);
          *(undefined8 *)puVar2 = *(undefined8 *)((local_40->m_backend).data._M_elems + 0xc);
          *(undefined8 *)(puVar2 + 2) = uVar20;
          puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x20);
          *(undefined8 *)puVar2 = uVar18;
          *(undefined8 *)(puVar2 + 2) = uVar19;
          puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = uVar16;
          *(undefined8 *)(puVar2 + 2) = uVar17;
          *(undefined8 *)&pnVar5[iVar23].m_backend.data = uVar8;
          *(undefined8 *)((long)&pnVar5[iVar23].m_backend.data + 8) = uVar15;
          pnVar5[iVar23].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
          pnVar5[iVar23].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
          iVar21 = (this->m_i_rowObj).m_backend.prec_elem;
          pnVar5[iVar23].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
          pnVar5[iVar23].m_backend.prec_elem = iVar21;
          pNVar9 = (this->m_scale).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)(pNVar9->val).m_backend.data._M_elems + lVar25);
          local_98.val.m_backend.fpclass = cpp_dec_float_finite;
          local_98.val.m_backend.prec_elem = 0x10;
          local_98.val.m_backend.data._M_elems[0] = 0;
          local_98.val.m_backend.data._M_elems[1] = 0;
          local_98.val.m_backend.data._M_elems[2] = 0;
          local_98.val.m_backend.data._M_elems[3] = 0;
          local_98.val.m_backend.data._M_elems[4] = 0;
          local_98.val.m_backend.data._M_elems[5] = 0;
          local_98.val.m_backend.data._M_elems[6] = 0;
          local_98.val.m_backend.data._M_elems[7] = 0;
          local_98.val.m_backend.data._M_elems[8] = 0;
          local_98.val.m_backend.data._M_elems[9] = 0;
          local_98.val.m_backend.data._M_elems[10] = 0;
          local_98.val.m_backend.data._M_elems[0xb] = 0;
          local_98.val.m_backend.data._M_elems[0xc] = 0;
          local_98.val.m_backend.data._M_elems[0xd] = 0;
          local_98.val.m_backend.data._M_elems._56_5_ = 0;
          local_98.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
          local_98.val.m_backend.exp = 0;
          local_98.val.m_backend.neg = false;
          pNVar31 = pNVar7;
          if ((&local_98 != pNVar9) && (pNVar31 = pNVar9, pNVar7 != &local_98)) {
            local_98.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
            local_98.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
            local_98.val.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
            local_98.val.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
            local_98.val.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
            local_98.val.m_backend.data._M_elems._40_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 10);
            local_98.val.m_backend.data._M_elems._48_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xc);
            uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xe);
            local_98.val.m_backend.data._M_elems._56_5_ = SUB85(uVar8,0);
            local_98.val.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_98.val.m_backend.exp =
                 *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25);
            local_98.val.m_backend.neg =
                 *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 4);
            local_98.val.m_backend._72_8_ =
                 *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)&local_98,
                     (cpp_dec_float<100U,_int,_void> *)pNVar31);
          VVar27 = ON_UPPER;
          if (local_98.val.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_e8,0,(type *)0x0);
            y = local_38;
            iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)&local_98,&local_e8);
            VVar27 = (VarStatus)(0 < iVar23);
          }
        }
        else {
          if ((VVar27 != ON_UPPER) || (iVar4 != this->m_minRhsIdx)) {
            if (iVar4 != iVar23) goto LAB_004454e4;
            goto LAB_0044554e;
          }
          pcVar26 = &(y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend;
          pcVar29 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)(pNVar7->val).m_backend.data._M_elems + lVar25);
          local_e8.fpclass = cpp_dec_float_finite;
          local_e8.prec_elem = 0x10;
          local_e8.data._M_elems[0] = 0;
          local_e8.data._M_elems[1] = 0;
          local_e8.data._M_elems[2] = 0;
          local_e8.data._M_elems[3] = 0;
          local_e8.data._M_elems[4] = 0;
          local_e8.data._M_elems[5] = 0;
          local_e8.data._M_elems[6] = 0;
          local_e8.data._M_elems[7] = 0;
          local_e8.data._M_elems[8] = 0;
          local_e8.data._M_elems[9] = 0;
          local_e8.data._M_elems[10] = 0;
          local_e8.data._M_elems[0xb] = 0;
          local_e8.data._M_elems[0xc] = 0;
          local_e8.data._M_elems[0xd] = 0;
          local_e8.data._M_elems._56_5_ = 0;
          local_e8.data._M_elems[0xf]._1_3_ = 0;
          local_e8.exp = 0;
          local_e8.neg = false;
          pcVar30 = pcVar26;
          if ((pcVar29 != &local_e8) && (pcVar30 = pcVar29, &local_e8 != pcVar26)) {
            local_e8.data._M_elems._0_8_ =
                 *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems;
            local_e8.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 2);
            local_e8.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 4);
            local_e8.data._M_elems._24_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 6);
            local_e8.data._M_elems._32_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 8);
            local_e8.data._M_elems._40_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 10);
            local_e8.data._M_elems._48_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xc);
            uVar8 = *(undefined8 *)
                     ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xe);
            local_e8.data._M_elems._56_5_ = SUB85(uVar8,0);
            local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_e8.exp = pcVar26->exp;
            local_e8.neg = pcVar26->neg;
            local_e8.fpclass = pcVar26->fpclass;
            local_e8.prec_elem = pcVar26->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    (&local_e8,pcVar30);
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar5[iVar4].m_backend.data = local_e8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = local_e8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = local_e8.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._24_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x20);
          *(undefined8 *)puVar2 = local_e8.data._M_elems._32_8_;
          *(undefined8 *)(puVar2 + 2) = local_e8.data._M_elems._40_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x30);
          *(undefined8 *)puVar2 = local_e8.data._M_elems._48_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_e8.data._M_elems[0xf]._1_3_,local_e8.data._M_elems._56_5_);
          pnVar5[iVar4].m_backend.exp = local_e8.exp;
          pnVar5[iVar4].m_backend.neg = local_e8.neg;
          pnVar5[iVar4].m_backend.fpclass = local_e8.fpclass;
          pnVar5[iVar4].m_backend.prec_elem = local_e8.prec_elem;
          iVar23 = this->m_i;
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = *(undefined8 *)(local_40->m_backend).data._M_elems;
          uVar15 = *(undefined8 *)((local_40->m_backend).data._M_elems + 2);
          uVar16 = *(undefined8 *)((local_40->m_backend).data._M_elems + 4);
          uVar17 = *(undefined8 *)((local_40->m_backend).data._M_elems + 6);
          uVar18 = *(undefined8 *)((local_40->m_backend).data._M_elems + 8);
          uVar19 = *(undefined8 *)((local_40->m_backend).data._M_elems + 10);
          uVar20 = *(undefined8 *)((local_40->m_backend).data._M_elems + 0xe);
          puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x30);
          *(undefined8 *)puVar2 = *(undefined8 *)((local_40->m_backend).data._M_elems + 0xc);
          *(undefined8 *)(puVar2 + 2) = uVar20;
          puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x20);
          *(undefined8 *)puVar2 = uVar18;
          *(undefined8 *)(puVar2 + 2) = uVar19;
          puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = uVar16;
          *(undefined8 *)(puVar2 + 2) = uVar17;
          *(undefined8 *)&pnVar5[iVar23].m_backend.data = uVar8;
          *(undefined8 *)((long)&pnVar5[iVar23].m_backend.data + 8) = uVar15;
          pnVar5[iVar23].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
          pnVar5[iVar23].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
          iVar21 = (this->m_i_rowObj).m_backend.prec_elem;
          pnVar5[iVar23].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
          pnVar5[iVar23].m_backend.prec_elem = iVar21;
          pNVar9 = (this->m_scale).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)(pNVar9->val).m_backend.data._M_elems + lVar25);
          local_98.val.m_backend.fpclass = cpp_dec_float_finite;
          local_98.val.m_backend.prec_elem = 0x10;
          local_98.val.m_backend.data._M_elems[0] = 0;
          local_98.val.m_backend.data._M_elems[1] = 0;
          local_98.val.m_backend.data._M_elems[2] = 0;
          local_98.val.m_backend.data._M_elems[3] = 0;
          local_98.val.m_backend.data._M_elems[4] = 0;
          local_98.val.m_backend.data._M_elems[5] = 0;
          local_98.val.m_backend.data._M_elems[6] = 0;
          local_98.val.m_backend.data._M_elems[7] = 0;
          local_98.val.m_backend.data._M_elems[8] = 0;
          local_98.val.m_backend.data._M_elems[9] = 0;
          local_98.val.m_backend.data._M_elems[10] = 0;
          local_98.val.m_backend.data._M_elems[0xb] = 0;
          local_98.val.m_backend.data._M_elems[0xc] = 0;
          local_98.val.m_backend.data._M_elems[0xd] = 0;
          local_98.val.m_backend.data._M_elems._56_5_ = 0;
          local_98.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
          local_98.val.m_backend.exp = 0;
          local_98.val.m_backend.neg = false;
          pNVar31 = pNVar7;
          if ((&local_98 != pNVar9) && (pNVar31 = pNVar9, pNVar7 != &local_98)) {
            local_98.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
            local_98.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
            local_98.val.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
            local_98.val.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
            local_98.val.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
            local_98.val.m_backend.data._M_elems._40_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 10);
            local_98.val.m_backend.data._M_elems._48_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xc);
            uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 0xe);
            local_98.val.m_backend.data._M_elems._56_5_ = SUB85(uVar8,0);
            local_98.val.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_98.val.m_backend.exp =
                 *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25);
            local_98.val.m_backend.neg =
                 *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 4);
            local_98.val.m_backend._72_8_ =
                 *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar25 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)&local_98,
                     (cpp_dec_float<100U,_int,_void> *)pNVar31);
          VVar27 = ON_LOWER;
          if (local_98.val.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_e8,0,(type *)0x0);
            y = local_38;
            iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)&local_98,&local_e8);
            VVar27 = (VarStatus)(iVar23 < 1);
          }
        }
        pVVar32 = rStatus->data;
        pVVar32[iVar4] = VVar27;
        bVar22 = true;
        if (iVar4 != this->m_i) {
          pVVar32 = pVVar32 + this->m_i;
          bVar22 = true;
          goto LAB_00445546;
        }
      }
LAB_0044554e:
      lVar24 = lVar24 + 1;
      lVar25 = lVar25 + 0x54;
    } while (lVar24 < (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}